

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDumpEquiv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Io_FileType_t FileType;
  long lVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  uint fVerbose;
  uint fByName;
  char *pcVar5;
  char *pFileName [2];
  Abc_Ntk_t *pNtks [2];
  uint local_60;
  char *local_58 [2];
  Abc_Ntk_t *local_48 [3];
  
  local_48[0] = (Abc_Ntk_t *)0x0;
  local_48[1] = (Abc_Ntk_t *)0x0;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fByName = 1;
  local_60 = 1000;
LAB_00260113:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Cnvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) {
      lVar3 = (long)globalUtilOptind;
      if (globalUtilOptind + 3 == argc) {
        local_58[0] = argv[lVar3];
        local_58[1] = argv[lVar3 + 1];
        pcVar4 = argv[lVar3 + 2];
        lVar3 = 0;
        while( true ) {
          pcVar5 = local_58[lVar3];
          FileType = Io_ReadFileType(pcVar5);
          pNtk = Io_Read(pcVar5,FileType,1,0);
          local_48[lVar3] = pNtk;
          if (pNtk == (Abc_Ntk_t *)0x0) break;
          Abc_NtkToAig(pNtk);
          lVar3 = lVar3 + 1;
          if (lVar3 != 1) {
            Abc_NtkDumpEquiv(local_48,pcVar4,local_60,fByName,fVerbose);
            Abc_NtkDelete(local_48[0]);
            Abc_NtkDelete(local_48[1]);
            return 0;
          }
        }
      }
      else {
        pcVar4 = "Expecting three file names on the command line.\n";
LAB_0026021d:
        Abc_Print(-1,pcVar4);
      }
      goto LAB_0026022e;
    }
    if (iVar2 == 0x6e) {
      fByName = fByName ^ 1;
      goto LAB_00260113;
    }
    if (iVar2 != 0x43) goto LAB_0026022e;
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
      goto LAB_0026021d;
    }
    local_60 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
    if ((int)local_60 < 0) {
LAB_0026022e:
      Abc_Print(-2,
                "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n"
               );
      Abc_Print(-2,"\t          computes equivalence classes of nodes in <file1> and <file2>\n");
      Abc_Print(-2,
                "\t          By default this procedure performs matching of primary inputs by name.\n"
               );
      Abc_Print(-2,
                "\t          Those inputs that cannot be matched are treated as free variables.\n");
      Abc_Print(-2,
                "\t          There is no effort to match primary outputs. Indeed, if two outputs\n")
      ;
      Abc_Print(-2,
                "\t          are equivalent, they will belong to the same equivalence class in the end.\n"
               );
      Abc_Print(-2,"\t-C num  : the maximum number of conflicts at each node [default = %d]\n",
                (ulong)local_60);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fByName == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-n      : enable matching of primary inputs by name [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v      : prints verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      Abc_Print(-2,"\t<file1> : first network whose nodes are considered\n");
      Abc_Print(-2,"\t<file2> : second network whose nodes are considered\n");
      Abc_Print(-2,"\t<file_dump_equiv> : text file with node equivalence classes\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDumpEquiv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpEquiv( Abc_Ntk_t * pNtks[2], char * pFileName, int nConfs, int fByName, int fVerbose );
    Abc_Ntk_t * pNtks[2] = {NULL};
    char * pFileName[2], * pFileNameOut;
    int c, nConfs = 1000, fByName = 1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'n':
            fByName ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 3 )
    {
        Abc_Print( -1, "Expecting three file names on the command line.\n" );
        goto usage;
    }
    pFileName[0] = argv[globalUtilOptind];
    pFileName[1] = argv[globalUtilOptind+1];
    pFileNameOut = argv[globalUtilOptind+2];
    for ( c = 0; c < 2; c++ )
    {
        pNtks[c] = Io_Read( pFileName[c], Io_ReadFileType(pFileName[c]), 1, 0 );
        if ( pNtks[c] == NULL )
            goto usage;
        Abc_NtkToAig( pNtks[c] );
    }
//    if ( Abc_NtkCiNum(pNtks[0]) != Abc_NtkCiNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary inputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else if ( Abc_NtkCoNum(pNtks[0]) != Abc_NtkCoNum(pNtks[1]) )
//        Abc_Print( -1, "The number of primary outputs of networks \"%s\" and \"%s\" does not match.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]) );
//    else
        Abc_NtkDumpEquiv( pNtks, pFileNameOut, nConfs, fByName, fVerbose );
    Abc_NtkDelete( pNtks[0] );
    Abc_NtkDelete( pNtks[1] );
    return 0;

usage:
    Abc_Print( -2, "usage: dump_equiv [-C num] [-nvh] <file1.blif> <file2.blif> <file_dump_equiv.txt>\n" );
    Abc_Print( -2, "\t          computes equivalence classes of nodes in <file1> and <file2>\n" );
    Abc_Print( -2, "\t          By default this procedure performs matching of primary inputs by name.\n" );
    Abc_Print( -2, "\t          Those inputs that cannot be matched are treated as free variables.\n" );
    Abc_Print( -2, "\t          There is no effort to match primary outputs. Indeed, if two outputs\n" );
    Abc_Print( -2, "\t          are equivalent, they will belong to the same equivalence class in the end.\n" );
    Abc_Print( -2, "\t-C num  : the maximum number of conflicts at each node [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-n      : enable matching of primary inputs by name [default = %s]\n", fByName? "yes": "no" );
    Abc_Print( -2, "\t-v      : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file1> : first network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file2> : second network whose nodes are considered\n" );
    Abc_Print( -2, "\t<file_dump_equiv> : text file with node equivalence classes\n" );
    return 1;
}